

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::PointerReader::getList
          (ListReader *__return_storage_ptr__,PointerReader *this,ElementSize expectedElementSize,
          word *defaultValue)

{
  unsigned_short uVar1;
  ushort uVar2;
  word *pwVar3;
  Arena *pAVar4;
  ulong uVar5;
  undefined6 uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  ElementSize EVar12;
  undefined7 in_register_00000011;
  WirePointer *pWVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  WirePointer *pWVar18;
  WirePointer *pWVar19;
  int iVar20;
  char cVar21;
  WirePointer *pWVar22;
  WirePointer *pWVar23;
  char *pcVar24;
  DebugComparison<int_&,_int> *pDVar25;
  bool bVar26;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  Exception *local_68;
  uint local_60;
  int local_5c;
  Fault f_3;
  WirePointerCount expectedPointersPerElement;
  uint pointerCount;
  CapTableReader *local_40;
  BitCount expectedDataBitsPerElement;
  
  local_60 = (uint)CONCAT71(in_register_00000011,expectedElementSize);
  pWVar22 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar22 = this->pointer;
  }
  local_68 = (Exception *)this->segment;
  local_5c = this->nestingLimit;
  pWVar13 = pWVar22 + 1;
  iVar20 = (int)*(uint64_t *)&(pWVar22->offsetAndKind).value;
  lVar15 = (long)(iVar20 >> 2);
  pWVar18 = pWVar13 + lVar15;
  if (((local_68 != (Exception *)0x0) &&
      (pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)->ptr,
      pWVar23 = (WirePointer *)(pwVar3 + (long)local_68->file), pWVar18 = pWVar23,
      (long)pwVar3 - (long)pWVar13 >> 3 <= lVar15)) &&
     (pWVar18 = pWVar13 + lVar15, (long)pWVar23 - (long)pWVar13 >> 3 < lVar15)) {
    pWVar18 = pWVar23;
  }
  local_40 = this->capTable;
  pWVar13 = (WirePointer *)defaultValue;
  if (iVar20 != 0 || (pWVar22->field_1).upper32Bits != 0) goto LAB_002082aa;
  do {
    while( true ) {
      if ((pWVar13 == (WirePointer *)0x0) ||
         (iVar20 = (int)*(uint64_t *)&(pWVar13->offsetAndKind).value,
         (pWVar13->field_1).upper32Bits == 0 && iVar20 == 0)) {
        __return_storage_ptr__->ptr = (byte *)0x0;
        __return_storage_ptr__->elementCount = 0;
        __return_storage_ptr__->step = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
        __return_storage_ptr__->segment = (SegmentReader *)0x0;
        __return_storage_ptr__->capTable = (CapTableReader *)0x0;
        __return_storage_ptr__->elementSize = (ElementSize)local_60;
        __return_storage_ptr__->nestingLimit = 0x7fffffff;
        return __return_storage_ptr__;
      }
      local_68 = (Exception *)0x0;
      pWVar18 = pWVar13 + (long)(iVar20 >> 2) + 1;
      defaultValue = (word *)0x0;
      pWVar22 = pWVar13;
LAB_002082aa:
      _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
      _kjCondition.left = &local_5c;
      _kjCondition.op.content.ptr = anon_var_dwarf_b826;
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < local_5c;
      pWVar13 = (WirePointer *)defaultValue;
      if (0 < local_5c) break;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    iVar20 = 2;
    pWVar23 = pWVar22;
    if ((local_68 == (Exception *)0x0) || ((*(uint64_t *)&(pWVar22->offsetAndKind).value & 3) != 2))
    goto LAB_002085df;
    pAVar4 = (Arena *)(local_68->ownFile).content.ptr;
    iVar7 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar22->field_1).upper32Bits);
    local_68 = (Exception *)CONCAT44(extraout_var,iVar7);
    _kjCondition.left = (int *)&local_68;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 != (Exception *)0x0;
    if (local_68 == (Exception *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      pDVar25 = (DebugComparison<int_&,_int> *)&f;
      goto LAB_002086dc;
    }
    uVar8 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value;
    pcVar24 = (char *)(ulong)(uVar8 >> 3);
    pcVar16 = local_68->file;
    if ((long)pcVar16 < (long)pcVar24) {
      pcVar24 = pcVar16;
    }
    uVar11 = 2 - (ulong)((uVar8 & 4) == 0);
    if (pcVar16 < pcVar24 + uVar11) {
LAB_00208369:
      f.exception = f.exception & 0xffffffffffffff00;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&f,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      pDVar25 = &_kjCondition;
LAB_002086dc:
      kj::_::Debug::Fault::~Fault((Fault *)pDVar25);
    }
    else {
      pWVar23 = (WirePointer *)
                (((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)->ptr +
                (long)pcVar24);
      uVar17 = (*(ReadLimiter **)&local_68->line)->limit;
      if (uVar17 < uVar11) {
        (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
        goto LAB_00208369;
      }
      (*(ReadLimiter **)&local_68->line)->limit = uVar17 - uVar11;
      if ((*(uint64_t *)&(pWVar22->offsetAndKind).value & 4) == 0) {
        pWVar22 = pWVar23 + 1;
        uVar8 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
        lVar15 = (long)((int)uVar8 >> 2);
        pWVar19 = pWVar22 + lVar15;
        if ((local_68 != (Exception *)0x0) &&
           ((pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)->ptr,
            pWVar18 = (WirePointer *)(pwVar3 + (long)local_68->file),
            lVar15 < (long)pwVar3 - (long)pWVar22 >> 3 ||
            ((long)pWVar18 - (long)pWVar22 >> 3 < lVar15)))) goto LAB_002085df;
LAB_002085ee:
        uVar8 = uVar8 & 3;
        _kjCondition.left = (int *)CONCAT44(1,uVar8);
        _kjCondition._8_8_ = anon_var_dwarf_b08b;
        _kjCondition.op.content.ptr = &DAT_00000005;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
        if (uVar8 != 1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                     "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      &_kjCondition,
                     (char (*) [84])
                     "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                    );
          pDVar25 = (DebugComparison<int_&,_int> *)&f;
          goto LAB_002086dc;
        }
        uVar8 = (pWVar23->field_1).upper32Bits;
        EVar12 = (ElementSize)uVar8 & INLINE_COMPOSITE;
        uVar10 = local_60 & 0xff;
        if (EVar12 != INLINE_COMPOSITE) {
          iVar20 = 1;
          f_3.exception._0_4_ = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar8 & 7) * 4);
          pointerCount = (uint)(EVar12 == POINTER);
          uVar11 = (ulong)(uVar8 >> 3);
          uVar14 = pointerCount * 0x40 + (uint)f_3.exception;
          if (local_68 == (Exception *)0x0) {
LAB_00208842:
            cVar21 = (char)local_60;
            if ((uVar8 & 7) == 0) {
              if (local_68 != (Exception *)0x0) {
                uVar17 = (*(ReadLimiter **)&local_68->line)->limit;
                if (uVar17 < uVar11) {
                  (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
                  f.exception = f.exception & 0xffffffffffffff00;
                  pDVar25 = &_kjCondition;
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)pDVar25,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x960,FAILED,
                             "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))",
                             "_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&f,
                             (char (*) [41])"Message contains amplified list pointer.");
                  goto LAB_00208b17;
                }
                (*(ReadLimiter **)&local_68->line)->limit = uVar17 - uVar11;
              }
            }
            else if ((cVar21 != '\x01') && (EVar12 == BIT)) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x969,FAILED,(char *)0x0,
                         "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                         ,(char (*) [106])0x2ba4dd);
              pDVar25 = &_kjCondition;
              goto LAB_00208b17;
            }
            expectedDataBitsPerElement = *(BitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)uVar10 * 4);
            _kjCondition.left = (int *)&expectedDataBitsPerElement;
            expectedPointersPerElement = (WirePointerCount)(cVar21 == '\x06');
            _kjCondition._8_8_ = &f_3;
            _kjCondition.result = expectedDataBitsPerElement <= (uint)f_3.exception;
            if ((uint)f_3.exception < expectedDataBitsPerElement) {
              pcVar16 = "expectedDataBitsPerElement <= dataSize";
              iVar20 = 0x979;
            }
            else {
              _kjCondition.result = EVar12 == POINTER || cVar21 != '\x06';
              _kjCondition.left = (int *)&expectedPointersPerElement;
              _kjCondition._8_8_ = &pointerCount;
              if (EVar12 == POINTER || cVar21 != '\x06') {
                __return_storage_ptr__->segment = (SegmentReader *)local_68;
                __return_storage_ptr__->capTable = local_40;
                __return_storage_ptr__->ptr = (byte *)pWVar19;
                __return_storage_ptr__->elementCount = uVar8 >> 3;
                __return_storage_ptr__->step = uVar14;
                __return_storage_ptr__->structDataSize = (uint)f_3.exception;
                __return_storage_ptr__->structPointerCount = (ushort)(EVar12 == POINTER);
                __return_storage_ptr__->elementSize = EVar12;
                __return_storage_ptr__->nestingLimit = local_5c + -1;
                goto LAB_002086e6;
              }
              pcVar16 = "expectedPointersPerElement <= pointerCount";
              iVar20 = 0x97d;
            }
            _kjCondition.op.content.size_ = 5;
            _kjCondition.op.content.ptr = " <= ";
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar20,FAILED,pcVar16,
                       "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                       (char (*) [72])
                       "Schema mismatch: Message contained list with incompatible element type.");
            pDVar25 = (DebugComparison<int_&,_int> *)&f;
          }
          else {
            uVar17 = uVar14 * uVar11 + 0x3f >> 6 & 0xffffffff;
            if ((char *)(((long)pWVar19 -
                          (long)((ArrayPtr<const_capnp::word> *)
                                &(local_68->ownFile).content.disposer)->ptr >> 3) + uVar17) <=
                local_68->file) {
              uVar5 = (*(ReadLimiter **)&local_68->line)->limit;
              if (uVar17 <= uVar5) {
                (*(ReadLimiter **)&local_68->line)->limit = uVar5 - uVar17;
                goto LAB_00208842;
              }
              (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            f.exception = f.exception & 0xffffffffffffff00;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x958,FAILED,"boundsCheck(segment, ptr, wordCount)",
                       "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&f,
                       (char (*) [319])
                       "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            pDVar25 = &_kjCondition;
          }
LAB_00208b17:
          kj::_::Debug::Fault::~Fault((Fault *)pDVar25);
          iVar20 = 2;
          goto LAB_002086e6;
        }
        f_3.exception._0_4_ = uVar8 >> 3;
        if (local_68 == (Exception *)0x0) {
LAB_002087c3:
          uVar8 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value;
          bVar26 = (uVar8 & 3) == 0;
          _kjCondition.left = (int *)((ulong)uVar8 & 0xffffffff00000003);
          _kjCondition._8_8_ = anon_var_dwarf_b08b;
          _kjCondition.op.content.ptr = &DAT_00000005;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar26);
          if (bVar26) {
            uVar8 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value >> 2 & 0x1fffffff;
            uVar11 = (ulong)uVar8;
            uVar14 = (uint)(pWVar19->field_1).structRef.ptrCount.value +
                     (uint)(pWVar19->field_1).structRef.dataSize.value;
            _kjCondition.left = (int *)(uVar14 * uVar11);
            _kjCondition._8_8_ = &f_3;
            _kjCondition.op.content.ptr = " <= ";
            piVar9 = (int *)(ulong)(uint)f_3.exception;
            _kjCondition.op.content.size_ = 5;
            bVar26 = (long)_kjCondition.left - (long)piVar9 == 0;
            _kjCondition.result = _kjCondition.left < piVar9 || bVar26;
            if (_kjCondition.left < piVar9 || bVar26) {
              if ((uVar14 == 0) && (local_68 != (Exception *)0x0)) {
                uVar17 = (*(ReadLimiter **)&local_68->line)->limit;
                if (uVar17 < uVar11) {
                  (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
                  f.exception = f.exception & 0xffffffffffffff00;
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)&_kjCondition,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x917,FAILED,"amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))"
                             ,"_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&f,
                             (char (*) [41])"Message contains amplified list pointer.");
                  pDVar25 = &_kjCondition;
                  goto LAB_002086dc;
                }
                (*(ReadLimiter **)&local_68->line)->limit = uVar17 - uVar11;
              }
              uVar6 = (undefined6)((ulong)_kjCondition.left >> 0x10);
              if (uVar10 - 2 < 4) {
                uVar1 = (pWVar19->field_1).structRef.dataSize.value;
                _kjCondition.left = (int *)(CONCAT62(uVar6,uVar1) & 0xffffffff);
                _kjCondition._8_8_ = anon_var_dwarf_b826;
                _kjCondition.op.content.ptr = (char *)0x4;
                _kjCondition.op.content.size_ = (size_t)(uVar1 != 0);
                if (uVar1 != 0) goto LAB_00208b92;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                          (&f,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                           "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                           ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                           (char (*) [84])
                           "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                          );
                pDVar25 = (DebugComparison<int_&,_int> *)&f;
              }
              else if (uVar10 == 6) {
                uVar1 = (pWVar19->field_1).structRef.ptrCount.value;
                _kjCondition.left = (int *)(CONCAT62(uVar6,uVar1) & 0xffffffff);
                _kjCondition._8_8_ = anon_var_dwarf_b826;
                _kjCondition.op.content.ptr = (char *)0x4;
                _kjCondition.op.content.size_ = (size_t)(uVar1 != 0);
                if (uVar1 != 0) goto LAB_00208b92;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                          (&f,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                           "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                           ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                           (char (*) [79])
                           "Schema mismatch: Expected a pointer list, but got a list of data-only structs."
                          );
                pDVar25 = (DebugComparison<int_&,_int> *)&f;
              }
              else {
                if (uVar10 != 1) {
LAB_00208b92:
                  uVar2 = (pWVar19->field_1).structRef.dataSize.value;
                  uVar1 = (pWVar19->field_1).structRef.ptrCount.value;
                  __return_storage_ptr__->segment = (SegmentReader *)local_68;
                  __return_storage_ptr__->capTable = local_40;
                  __return_storage_ptr__->ptr = (byte *)(pWVar19 + 1);
                  __return_storage_ptr__->elementCount = uVar8;
                  __return_storage_ptr__->step = uVar14 * 0x40;
                  __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
                  __return_storage_ptr__->structPointerCount = uVar1;
                  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
                  __return_storage_ptr__->nestingLimit = local_5c + -1;
                  iVar20 = 1;
                  goto LAB_002086e6;
                }
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                          ((Fault *)&_kjCondition,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x92a,FAILED,(char *)0x0,
                           "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                           ,(char (*) [106])0x2ba02b);
                pDVar25 = &_kjCondition;
              }
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount"
                         ,
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
              pDVar25 = (DebugComparison<int_&,_int> *)&f;
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
            pDVar25 = (DebugComparison<int_&,_int> *)&f;
          }
        }
        else {
          if ((char *)(((long)pWVar19 -
                        (long)((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)
                              ->ptr >> 3) + (ulong)(uint)f_3.exception + 1) <= local_68->file) {
            uVar11 = (ulong)(uint)f_3.exception + 1;
            uVar17 = (*(ReadLimiter **)&local_68->line)->limit;
            if (uVar11 <= uVar17) {
              (*(ReadLimiter **)&local_68->line)->limit = uVar17 - uVar11;
              goto LAB_002087c3;
            }
            (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
          }
          f.exception = f.exception & 0xffffffffffffff00;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x900,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          pDVar25 = &_kjCondition;
        }
        goto LAB_002086dc;
      }
      pAVar4 = (Arena *)(local_68->ownFile).content.ptr;
      iVar7 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar23->field_1).upper32Bits);
      f.exception = (Exception *)CONCAT44(extraout_var_00,iVar7);
      _kjCondition.right = 0;
      _kjCondition._12_4_ = 0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = f.exception != (Exception *)0x0;
      if (f.exception == (Exception *)0x0) {
        _kjCondition.left = (int *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x25f,FAILED,"newSegment != nullptr",
                   "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                   (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                   (char (*) [56])"Message contains double-far pointer to unknown segment.");
      }
      else {
        uVar8 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value & 3;
        _kjCondition.left = (int *)CONCAT44(2,uVar8);
        _kjCondition._8_8_ = anon_var_dwarf_b08b;
        _kjCondition.op.content.ptr = &DAT_00000005;
        _kjCondition.op.content.size_ = (size_t)(uVar8 == 2);
        if (uVar8 == 2) {
          pcVar16 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar23->offsetAndKind).value >> 3);
          if ((long)(f.exception)->file < (long)pcVar16) {
            pcVar16 = (f.exception)->file;
          }
          pWVar18 = (WirePointer *)
                    (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)->
                     ptr + (long)pcVar16);
          pWVar23 = pWVar23 + 1;
          local_68 = f.exception;
          goto LAB_002085df;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                   "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                   (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   &_kjCondition,(char (*) [51])"Second word of double-far pad must be far pointer."
                  );
      }
      pWVar18 = (WirePointer *)0x0;
      kj::_::Debug::Fault::~Fault(&f_3);
      pWVar23 = pWVar23 + 1;
LAB_002085df:
      if (pWVar18 != (WirePointer *)0x0) {
        uVar8 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
        pWVar19 = pWVar18;
        goto LAB_002085ee;
      }
    }
LAB_002086e6:
    if (iVar20 != 2) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getList(ElementSize expectedElementSize, const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, expectedElementSize, nestingLimit);
}